

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_sign_helper
              (secp256k1_scalar *sigs,secp256k1_scalar *message,secp256k1_scalar *k,secp256k1_ge *r,
              secp256k1_scalar *sk)

{
  int iVar1;
  uint uVar2;
  secp256k1_scalar sigr;
  secp256k1_scalar sStack_68;
  secp256k1_scalar local_48;
  
  secp256k1_fe_normalize(&r->x);
  iVar1 = secp256k1_ecdsa_adaptor_fe_to_scalar(&sStack_68,&r->x);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    secp256k1_scalar_mul(&local_48,&sStack_68,sk);
    secp256k1_scalar_add(&local_48,&local_48,message);
    secp256k1_scalar_inverse(sigs,k);
    secp256k1_scalar_mul(sigs,sigs,&local_48);
    uVar2 = secp256k1_scalar_is_zero(sigs);
    uVar2 = uVar2 ^ 1;
  }
  return uVar2;
}

Assistant:

int secp256k1_ecdsa_adaptor_sign_helper(secp256k1_scalar *sigs, secp256k1_scalar *message, secp256k1_scalar *k, secp256k1_ge *r, secp256k1_scalar *sk) {
    secp256k1_scalar sigr;
    secp256k1_scalar n;

    secp256k1_fe_normalize(&r->x);
    if (!secp256k1_ecdsa_adaptor_fe_to_scalar(&sigr, &r->x)) {
        return 0;
    }
    secp256k1_scalar_mul(&n, &sigr, sk);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, k);
    secp256k1_scalar_mul(sigs, sigs, &n);

    secp256k1_scalar_clear(&n);
    return !secp256k1_scalar_is_zero(sigs);
}